

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inv_translator_app.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string word;
  string line;
  InverseTranslator InvTranslator;
  istringstream str;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  value_type local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  InverseTranslator local_1d8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  InverseTranslator::InverseTranslator(&local_1d8);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_1f8,cVar1);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1f8,_S_in);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::operator>>((istream *)local_1b0,(string *)&local_218);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_238,&local_218);
  }
  if ((long)local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      InverseTranslator::translate
                (&local_258,&local_1d8,
                 (string *)
                 ((long)&((local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)CONCAT71(local_258._M_dataplus._M_p._1_7_,
                                           local_258._M_dataplus._M_p._0_1_),
                          local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
          &local_258.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_))
        ;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < ((long)local_238.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_238.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
  }
  if (local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    InverseTranslator::translate
              (&local_258,&local_1d8,
               local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               (char *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_),
               local_258._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
        &local_258.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_));
    }
  }
  local_258._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_258,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  local_1d8.super_Translator._vptr_Translator = (_func_int **)&PTR_translate_00107d38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.vowels._M_dataplus._M_p != &local_1d8.vowels.field_2) {
    operator_delete(local_1d8.vowels._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){

    InverseTranslator InvTranslator;
    std::vector<std::string> words;
    
    std::string line;
    getline(std::cin, line);
    
    std::istringstream str(line);
    std::string word;
        
    while( str >> word ) {
      words.push_back(word);
    }
      
    for(int n = 0; n < words.size()-1; n++) {
        std::cout << InvTranslator.translate(words[n]) << " ";
    }

    if (!words.empty()) {
        std::cout << InvTranslator.translate(words.back());
    }
    std::cout << '\n';

    return 0;
}